

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::UpdateNewScObjectCache
               (Var function,Var instance,ScriptContext *requestContext)

{
  code *pcVar1;
  DynamicObject *pDVar2;
  ConstructorCache *pCVar3;
  undefined8 this;
  bool bVar4;
  byte bVar5;
  ImplicitCallFlags IVar6;
  uint16 uVar7;
  TypeId typeId;
  int iVar8;
  uint uVar9;
  ThreadContext *threadContext;
  ScriptContext *pSVar10;
  undefined4 *puVar11;
  ScriptContext *pSVar12;
  DynamicType *pDVar13;
  RecyclableObject *pRVar14;
  RecyclableObject *pRVar15;
  Utf8SourceInfo *this_00;
  undefined4 extraout_var;
  DynamicTypeHandler *pDVar16;
  char16 *pcVar17;
  DynamicType *local_328;
  char16_t *local_310;
  DynamicProfileInfo *local_268;
  wchar local_178 [4];
  char16 debugStringBuffer_1 [42];
  int inlineSlotCapacityBeforeShrink;
  DynamicTypeHandler *cachedTypeHandler;
  DynamicType *cachedType;
  char16 debugStringBuffer [42];
  char16 *ctorName;
  PropertyIndex pi;
  DynamicProfileInfo *profileInfo;
  DynamicTypeHandler *pDStack_88;
  bool cachedProtoCanBeCached;
  DynamicTypeHandler *typeHandler;
  DynamicType *type;
  DynamicObject *object;
  FunctionBody *constructorBody;
  ConstructorCache *pCStack_60;
  bool finalizeCachedType;
  ConstructorCache *constructorCache;
  JavascriptFunction *local_48;
  JavascriptFunction *constructor;
  JsReentLock reentrancylock;
  ScriptContext *requestContext_local;
  Var instance_local;
  Var function_local;
  
  reentrancylock._24_8_ = requestContext;
  threadContext = ScriptContext::GetThreadContext(requestContext);
  JsReentLock::JsReentLock((JsReentLock *)&constructor,threadContext);
  local_48 = VarTo<Js::JavascriptFunction>(function);
  pSVar10 = RecyclableObject::GetScriptContext((RecyclableObject *)local_48);
  if (pSVar10 != (ScriptContext *)reentrancylock._24_8_) {
    constructorCache._0_4_ = 1;
    goto LAB_00fa329e;
  }
  pCStack_60 = JavascriptFunction::GetConstructorCache(local_48);
  bVar4 = ConstructorCache::IsConsistent(pCStack_60);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a25,"(constructorCache->IsConsistent())",
                                "constructorCache->IsConsistent()");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar4 = ConstructorCache::IsDefault(pCStack_60);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a26,"(!ConstructorCache::IsDefault(constructorCache))",
                                "!ConstructorCache::IsDefault(constructorCache)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pSVar10 = ConstructorCache::GetScriptContext(pCStack_60);
  pSVar12 = RecyclableObject::GetScriptContext((RecyclableObject *)local_48);
  if (pSVar10 != pSVar12) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a27,
                                "(constructorCache->GetScriptContext() == constructor->GetScriptContext())"
                                ,
                                "Why did we populate a constructor cache with a mismatched script context?"
                               );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar4 = ConstructorCache::IsPopulated(pCStack_60);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a28,"(constructorCache->IsPopulated())",
                                "Why are we updating a constructor cache that hasn\'t been populated?"
                               );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar4 = ConstructorCache::NeedsUpdateAfterCtor(pCStack_60);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a2c,"(constructorCache->NeedsUpdateAfterCtor())",
                                "Why are we updating a constructor cache that doesn\'t need to be updated?"
                               );
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar5 = ConstructorCache::CallCount(pCStack_60);
  constructorBody._7_1_ = DAT_01e9e320 <= (int)(uint)bVar5;
  if ((bool)constructorBody._7_1_) {
    ConstructorCache::ClearUpdateAfterCtor(pCStack_60);
  }
  else {
    ConstructorCache::IncCallCount(pCStack_60);
  }
  object = (DynamicObject *)JavascriptFunction::GetFunctionBody(local_48);
  if ((FunctionBody *)object == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a3a,"(constructorBody != nullptr)",
                                "Constructor function doesn\'t have a function body.");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar4 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a3b,"(VarIs<RecyclableObject>(instance))",
                                "VarIs<RecyclableObject>(instance)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar4 = ConstructorCache::IsInvalidated(pCStack_60);
  if (bVar4) {
    TraceUpdateConstructorCache
              (pCStack_60,(FunctionBody *)object,false,L"because cache is invalidated");
    constructorCache._0_4_ = 1;
    goto LAB_00fa329e;
  }
  pDVar13 = ConstructorCache::GetGuardValueAsType(pCStack_60);
  if (pDVar13 == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a48,"(constructorCache->GetGuardValueAsType() != nullptr)",
                                "constructorCache->GetGuardValueAsType() != nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pRVar14 = VarTo<Js::RecyclableObject>(instance);
  typeId = RecyclableObject::GetTypeId(pRVar14);
  bVar4 = DynamicType::Is(typeId);
  if (!bVar4) {
    TraceUpdateConstructorCache
              (pCStack_60,(FunctionBody *)object,false,L"because ctor return a non-object value");
    constructorCache._0_4_ = 1;
    goto LAB_00fa329e;
  }
  type = (DynamicType *)UnsafeVarTo<Js::DynamicObject>(instance);
  typeHandler = (DynamicTypeHandler *)DynamicObject::GetDynamicType((DynamicObject *)type);
  pDStack_88 = DynamicType::GetTypeHandler((DynamicType *)typeHandler);
  bVar4 = ParseableFunctionInfo::GetHasOnlyThisStmts((ParseableFunctionInfo *)object);
  if (bVar4) {
    iVar8 = (*pDStack_88->_vptr_DynamicTypeHandler[5])();
    if (iVar8 == 0) {
      ParseableFunctionInfo::SetHasOnlyThisStmts((ParseableFunctionInfo *)object,false);
      TraceUpdateConstructorCache
                (pCStack_60,(FunctionBody *)object,false,L"because final type is not shareable");
    }
    else {
      iVar8 = (*pDStack_88->_vptr_DynamicTypeHandler[6])();
      if (iVar8 < 0xfffe) {
        profileInfo._7_1_ = 0;
        pRVar14 = Js::Type::GetPrototype((Type *)typeHandler);
        pRVar15 = GetPrototypeObjectForConstructorCache
                            ((RecyclableObject *)local_48,(ScriptContext *)reentrancylock._24_8_,
                             (bool *)((long)&profileInfo + 7));
        if (pRVar14 != pRVar15) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1a68,
                                      "(type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached))"
                                      ,
                                      "type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached)"
                                     );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        if ((profileInfo._7_1_ & 1) == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1a69,"(cachedProtoCanBeCached)","cachedProtoCanBeCached");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        pSVar10 = Js::Type::GetScriptContext((Type *)typeHandler);
        pSVar12 = ConstructorCache::GetScriptContext(pCStack_60);
        if (pSVar10 != pSVar12) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1a6a,
                                      "(type->GetScriptContext() == constructorCache->GetScriptContext())"
                                      ,
                                      "type->GetScriptContext() == constructorCache->GetScriptContext()"
                                     );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        pRVar14 = Js::Type::GetPrototype((Type *)typeHandler);
        pDVar13 = ConstructorCache::GetType(pCStack_60);
        pRVar15 = Js::Type::GetPrototype(&pDVar13->super_Type);
        if (pRVar14 != pRVar15) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1a6b,
                                      "(type->GetPrototype() == constructorCache->GetType()->GetPrototype())"
                                      ,
                                      "type->GetPrototype() == constructorCache->GetType()->GetPrototype()"
                                     );
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        DynamicTypeHandler::SetMayBecomeShared(pDStack_88);
        DynamicType::ShareType((DynamicType *)typeHandler);
        bVar4 = FunctionBody::HasDynamicProfileInfo((FunctionBody *)object);
        if (bVar4) {
          local_268 = FunctionBody::GetAnyDynamicProfileInfo((FunctionBody *)object);
        }
        else {
          local_268 = (DynamicProfileInfo *)0x0;
        }
        if ((local_268 == (DynamicProfileInfo *)0x0) ||
           (IVar6 = DynamicProfileInfo::GetImplicitCallFlags(local_268), ImplicitCall_None < IVar6))
        {
          pRVar14 = Js::Type::GetPrototype((Type *)typeHandler);
          bVar4 = CheckIfPrototypeChainHasOnlyWritableDataProperties(pRVar14);
          if (!bVar4) {
            if (((local_268 != (DynamicProfileInfo *)0x0) &&
                (IVar6 = DynamicProfileInfo::GetImplicitCallFlags(local_268),
                (IVar6 & 0xea) == ImplicitCall_HasNoInfo)) &&
               (local_268 != (DynamicProfileInfo *)0x0)) {
              pRVar14 = Js::Type::GetPrototype((Type *)typeHandler);
              bVar4 = CheckIfPrototypeChainHasOnlyWritableDataProperties(pRVar14);
              if ((bVar4) &&
                 (bVar4 = Phases::IsEnabled((Phases *)&DAT_01ec1678,HostOptPhase), bVar4)) {
                iVar8 = (*(object->super_RecyclableObject).super_FinalizableObject.
                          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
                pCVar3 = pCStack_60;
                pDVar2 = object;
                if (object == (DynamicObject *)0x0) {
                  local_310 = L"(null)";
                }
                else {
                  local_310 = FunctionProxy::GetDebugNumberSet
                                        ((FunctionProxy *)object,(wchar (*) [42])&cachedType);
                }
                Output::Print(L"CtorCache: %s cache (0x%p) for ctor %s (#%u) did not update because external call"
                              ,pCVar3,pDVar2,CONCAT44(extraout_var,iVar8),local_310);
                Output::Print(L"\n");
                Output::Flush();
              }
            }
            goto LAB_00fa2fcd;
          }
        }
        for (ctorName._6_2_ = 0; iVar8 = (*pDStack_88->_vptr_DynamicTypeHandler[6])(),
            this = reentrancylock._24_8_, (int)(uint)ctorName._6_2_ < iVar8;
            ctorName._6_2_ = ctorName._6_2_ + 1) {
          iVar8 = (*pDStack_88->_vptr_DynamicTypeHandler[8])
                            (pDStack_88,reentrancylock._24_8_,(ulong)ctorName._6_2_);
          ScriptContext::RegisterConstructorCache((ScriptContext *)this,iVar8,pCStack_60);
        }
        this_00 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)object);
        bVar4 = Utf8SourceInfo::GetIsLibraryCode(this_00);
        if (!bVar4) {
          pSVar10 = RecyclableObject::GetScriptContext((RecyclableObject *)local_48);
          bVar4 = ScriptContext::IsScriptContextInDebugMode(pSVar10);
          if (bVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x1a7d,
                                        "(constructorBody->GetUtf8SourceInfo()->GetIsLibraryCode() || !constructor->GetScriptContext()->IsScriptContextInDebugMode())"
                                        ,
                                        "constructorBody->GetUtf8SourceInfo()->GetIsLibraryCode() || !constructor->GetScriptContext()->IsScriptContextInDebugMode()"
                                       );
            if (!bVar4) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
        pCVar3 = pCStack_60;
        pDVar16 = typeHandler;
        pSVar10 = RecyclableObject::GetScriptContext((RecyclableObject *)local_48);
        bVar4 = ConstructorCache::TryUpdateAfterConstructor(pCVar3,(DynamicType *)pDVar16,pSVar10);
        if (bVar4) {
          TraceUpdateConstructorCache(pCStack_60,(FunctionBody *)object,true,L"");
        }
        else {
          TraceUpdateConstructorCache
                    (pCStack_60,(FunctionBody *)object,false,
                     L"because number of slots > MaxCachedSlotCount");
        }
      }
      else {
        ParseableFunctionInfo::SetHasOnlyThisStmts((ParseableFunctionInfo *)object,false);
        TraceUpdateConstructorCache
                  (pCStack_60,(FunctionBody *)object,false,
                   L"because final type has too many properties");
      }
    }
  }
  else {
    TraceUpdateConstructorCache
              (pCStack_60,(FunctionBody *)object,false,L"because ctor has not only this statements")
    ;
  }
LAB_00fa2fcd:
  if (((constructorBody._7_1_ & 1) != 0) && (bVar4 = ConstructorCache::IsEnabled(pCStack_60), bVar4)
     ) {
    bVar4 = ConstructorCache::NeedsTypeUpdate(pCStack_60);
    if (bVar4) {
      local_328 = ConstructorCache::GetPendingType(pCStack_60);
    }
    else {
      local_328 = ConstructorCache::GetType(pCStack_60);
    }
    pDVar16 = DynamicType::GetTypeHandler(local_328);
    uVar7 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar16);
    if (uVar7 != 0) {
      uVar7 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar16);
      uVar9 = (uint)uVar7;
      (*pDVar16->_vptr_DynamicTypeHandler[0x3d])();
      ConstructorCache::UpdateInlineSlotCount(pCStack_60);
      uVar7 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar16);
      if (uVar9 < uVar7) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1acd,
                                    "(inlineSlotCapacityBeforeShrink >= cachedTypeHandler->GetInlineSlotCapacity())"
                                    ,
                                    "inlineSlotCapacityBeforeShrink >= cachedTypeHandler->GetInlineSlotCapacity()"
                                   );
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      bVar4 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineSlotsPhase);
      if ((bVar4) && (uVar7 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar16), uVar9 != uVar7)) {
        pcVar17 = FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)object,(wchar (*) [42])local_178);
        uVar7 = DynamicTypeHandler::GetInlineSlotCapacity(pDVar16);
        Output::Print(L"Inline slot capacity shrunk: Function:%04s Before:%d After:%d\n",pcVar17,
                      (ulong)uVar9,(ulong)uVar7);
      }
    }
  }
  constructorCache._0_4_ = 0;
LAB_00fa329e:
  JsReentLock::~JsReentLock((JsReentLock *)&constructor);
  return;
}

Assistant:

void JavascriptOperators::UpdateNewScObjectCache(Var function, Var instance, ScriptContext* requestContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(UpdateNewScObjectCache, reentrancylock, requestContext->GetThreadContext());
        JavascriptFunction* constructor = VarTo<JavascriptFunction>(function);
        if(constructor->GetScriptContext() != requestContext)
        {
            // The cache is populated only when the constructor function's context is the same as the calling context. However,
            // the cached type is not finalized yet and may not be until multiple calls to the constructor have been made (see
            // flag ConstructorCallsRequiredToFinalizeCachedType). A subsequent call to the constructor may be made from a
            // different context, so ignore those cross-context calls and wait for the constructor to be called from its own
            // context again to finalize the cached type.
            return;
        }

        // Review : What happens if the cache got invalidated between NewScObject and here?
        // Should we allocate new?  Should we mark it as polymorphic?
        ConstructorCache* constructorCache = constructor->GetConstructorCache();
        Assert(constructorCache->IsConsistent());
        Assert(!ConstructorCache::IsDefault(constructorCache));
        AssertMsg(constructorCache->GetScriptContext() == constructor->GetScriptContext(), "Why did we populate a constructor cache with a mismatched script context?");
        AssertMsg(constructorCache->IsPopulated(), "Why are we updating a constructor cache that hasn't been populated?");

        // The presence of the updateAfterCtor flag guarantees that this cache hasn't been used in JIT-ed fast path.  Even, if the
        // cache is invalidated, this flag is not changed.
        AssertMsg(constructorCache->NeedsUpdateAfterCtor(), "Why are we updating a constructor cache that doesn't need to be updated?");

        const bool finalizeCachedType =
            constructorCache->CallCount() >= CONFIG_FLAG(ConstructorCallsRequiredToFinalizeCachedType);
        if(!finalizeCachedType)
        {
            constructorCache->IncCallCount();
        }
        else
        {
            constructorCache->ClearUpdateAfterCtor();
        }

        FunctionBody* constructorBody = constructor->GetFunctionBody();
        AssertMsg(constructorBody != nullptr, "Constructor function doesn't have a function body.");
        Assert(VarIs<RecyclableObject>(instance));

        // The cache might have been invalidated between NewScObjectCommon and UpdateNewScObjectCache.  This could occur, for example, if
        // the constructor updates its own prototype property.  If that happens we don't want to re-populate it here.  A new cache will
        // be created when the constructor is called again.
        if (constructorCache->IsInvalidated())
        {
#if DBG_DUMP
            TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because cache is invalidated"));
#endif
            return;
        }

        Assert(constructorCache->GetGuardValueAsType() != nullptr);

        if (DynamicType::Is(VarTo<RecyclableObject>(instance)->GetTypeId()))
        {
            DynamicObject *object = UnsafeVarTo<DynamicObject>(instance);
            DynamicType* type = object->GetDynamicType();
            DynamicTypeHandler* typeHandler = type->GetTypeHandler();

            if (constructorBody->GetHasOnlyThisStmts())
            {
                if (!typeHandler->IsSharable())
                {
                    // Dynamic type created is not sharable.
                    // So in future don't try to check for "this assignment optimization".
                    constructorBody->SetHasOnlyThisStmts(false);
#if DBG_DUMP
                    TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because final type is not shareable"));
#endif
                }
                else if (typeHandler->GetPropertyCount() >= Js::PropertyIndexRanges<PropertyIndex>::MaxValue)
                {
                    // Dynamic type created has too many properties.
                    // So in future don't try to check for "this assignment optimization".
                    constructorBody->SetHasOnlyThisStmts(false);
#if DBG_DUMP
                    TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because final type has too many properties"));
#endif
                }
                else
                {
#if DBG
                    bool cachedProtoCanBeCached = false;
                    Assert(type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached));
                    Assert(cachedProtoCanBeCached);
                    Assert(type->GetScriptContext() == constructorCache->GetScriptContext());
                    Assert(type->GetPrototype() == constructorCache->GetType()->GetPrototype());
#endif

                    typeHandler->SetMayBecomeShared();
                    // CONSIDER: Remove only this for delayed type sharing.
                    type->ShareType();

#if ENABLE_PROFILE_INFO
                    DynamicProfileInfo* profileInfo = constructorBody->HasDynamicProfileInfo() ? constructorBody->GetAnyDynamicProfileInfo() : nullptr;
                    if ((profileInfo != nullptr && profileInfo->GetImplicitCallFlags() <= ImplicitCall_None) ||
                        CheckIfPrototypeChainHasOnlyWritableDataProperties(type->GetPrototype()))
                    {

                        for (PropertyIndex pi = 0; pi < typeHandler->GetPropertyCount(); pi++)
                        {
                            requestContext->RegisterConstructorCache(typeHandler->GetPropertyId(requestContext, pi), constructorCache);
                        }

                        Assert(constructorBody->GetUtf8SourceInfo()->GetIsLibraryCode() || !constructor->GetScriptContext()->IsScriptContextInDebugMode());

                        if (constructorCache->TryUpdateAfterConstructor(type, constructor->GetScriptContext()))
                        {
#if DBG_DUMP
                            TraceUpdateConstructorCache(constructorCache, constructorBody, true, _u(""));
#endif
                        }
                        else
                        {
#if DBG_DUMP
                            TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because number of slots > MaxCachedSlotCount"));
#endif
                        }
                    }
#if DBG_DUMP
                    else
                    {
                        if (profileInfo &&
                            ((profileInfo->GetImplicitCallFlags() & ~(Js::ImplicitCall_External | Js::ImplicitCall_Accessor)) == 0) &&
                            profileInfo != nullptr && CheckIfPrototypeChainHasOnlyWritableDataProperties(type->GetPrototype()) &&
                            Js::Configuration::Global.flags.Trace.IsEnabled(Js::HostOptPhase))
                        {
                            const char16* ctorName = constructorBody->GetDisplayName();
                            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                            Output::Print(_u("CtorCache: %s cache (0x%p) for ctor %s (#%u) did not update because external call"),
                                constructorCache, constructorBody, ctorName, constructorBody ? constructorBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"));
                            Output::Print(_u("\n"));
                            Output::Flush();
                        }
                    }
#endif
#endif
                }
            }
            else
            {
#if DBG_DUMP
                TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because ctor has not only this statements"));
#endif
            }
        }
        else
        {
            // Even though this constructor apparently returned something other than the default object we created,
            // it still makes sense to cache the parameters of the default object, since we must create it every time, anyway.
#if DBG_DUMP
            TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because ctor return a non-object value"));
#endif
            return;
        }

        // Whatever the constructor returned, if we're caching a type we want to be sure we shrink its inline slot capacity.
        if (finalizeCachedType && constructorCache->IsEnabled())
        {
            DynamicType* cachedType = constructorCache->NeedsTypeUpdate() ? constructorCache->GetPendingType() : constructorCache->GetType();
            DynamicTypeHandler* cachedTypeHandler = cachedType->GetTypeHandler();

            // Consider: We could delay inline slot capacity shrinking until the second time this constructor is invoked.  In some cases
            // this might permit more properties to remain inlined if the objects grow after constructor.  This would require flagging
            // the cache as special (already possible) and forcing the shrinking during work item creation if we happen to JIT this
            // constructor while the cache is in this special state.
            if (cachedTypeHandler->GetInlineSlotCapacity())
            {
#if DBG_DUMP
                int inlineSlotCapacityBeforeShrink = cachedTypeHandler->GetInlineSlotCapacity();
#endif

                // Note that after the cache has been updated and might have been used in the JIT-ed code, it is no longer legal to
                // shrink the inline slot capacity of the type.  That's because we allocate memory for a fixed number of inlined properties
                // and if that number changed on the type, this update wouldn't get reflected in JIT-ed code and we would allocate objects
                // of a wrong size.  This could conceivably happen if the original object got collected, and with it some of the successor
                // types also.  If then another constructor has the same prototype and needs to populate its own cache, it would attempt to
                // shrink inlined slots again.  If all surviving type handlers have smaller inline slot capacity, we would shrink it further.
                // To address this problem the type handler has a bit indicating its inline slots have been shrunk already.  If that bit is
                // set ShrinkSlotAndInlineSlotCapacity does nothing.
                cachedTypeHandler->ShrinkSlotAndInlineSlotCapacity();
                constructorCache->UpdateInlineSlotCount();

#if DBG_DUMP
                Assert(inlineSlotCapacityBeforeShrink >= cachedTypeHandler->GetInlineSlotCapacity());
                if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::InlineSlotsPhase))
                {
                    if (inlineSlotCapacityBeforeShrink != cachedTypeHandler->GetInlineSlotCapacity())
                    {
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                        Output::Print(_u("Inline slot capacity shrunk: Function:%04s Before:%d After:%d\n"),
                            constructorBody->GetDebugNumberSet(debugStringBuffer), inlineSlotCapacityBeforeShrink, cachedTypeHandler->GetInlineSlotCapacity());
                    }
                }
#endif
            }
        }
        JIT_HELPER_END(UpdateNewScObjectCache);
    }